

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::MakeInputsBeProtoPathRelative
          (CommandLineInterface *this,DiskSourceTree *source_tree,
          DescriptorDatabase *fallback_database)

{
  string *psVar1;
  string *psVar2;
  bool bVar3;
  string *proto;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_file;
  
  psVar1 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    proto = psVar2;
    if (proto == psVar1) break;
    bVar3 = MakeProtoProtoPathRelative(this,source_tree,proto,fallback_database);
    psVar2 = proto + 1;
  } while (bVar3);
  return proto == psVar1;
}

Assistant:

bool CommandLineInterface::MakeInputsBeProtoPathRelative(
    DiskSourceTree* source_tree, DescriptorDatabase* fallback_database) {
  for (auto& input_file : input_files_) {
    if (!MakeProtoProtoPathRelative(source_tree, &input_file,
                                    fallback_database)) {
      return false;
    }
  }

  return true;
}